

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape__hollow
          (ColladaParserAutoGen14Private *this)

{
  ParserChar **buffer;
  ColladaParserAutoGen14 *pCVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined1 uVar4;
  bool failed;
  
  failed = SUB81((ulong)in_RAX >> 0x38,0);
  buffer = &(this->
            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
            ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  bVar2 = GeneratedSaxParser::Utils::toBool
                    (buffer,(this->
                            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                            ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack,&failed);
  if (failed == false) {
    pCVar1 = (this->
             super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
             ).mImpl;
    iVar3 = (*pCVar1->_vptr_ColladaParserAutoGen14[0x219])(pCVar1,(ulong)bVar2);
    uVar4 = (undefined1)iVar3;
  }
  else {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                       ERROR_TEXTDATA_PARSING_FAILED,0x6f63367,(ParserChar *)0x0,
                       (this->
                       super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData);
    uVar4 = !bVar2;
  }
  if (*buffer != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  *buffer = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return (bool)uVar4;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape__hollow()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__rigid_body__technique_common__shape__hollow();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
bool parameter = GeneratedSaxParser::Utils::toBool((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__rigid_body__technique_common__shape__hollow(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_HOLLOW, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}